

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

double fasttext::updateArgGauss<double>
                 (double val,double min,double max,double startSigma,double endSigma,double t,
                 bool linear,minstd_rand *rng)

{
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double retVal;
  undefined8 local_48;
  
  local_48 = getArgGauss<double>(val,(minstd_rand *)min,max,startSigma,endSigma,t._7_1_);
  if (in_XMM2_Qa < local_48) {
    local_48 = in_XMM2_Qa;
  }
  if (local_48 < in_XMM1_Qa) {
    local_48 = in_XMM1_Qa;
  }
  return local_48;
}

Assistant:

T updateArgGauss(
    T val,
    T min,
    T max,
    double startSigma,
    double endSigma,
    double t,
    bool linear,
    std::minstd_rand& rng) {
  T retVal = getArgGauss(val, rng, startSigma, endSigma, t, linear);
  if (retVal > max) {
    retVal = max;
  }
  if (retVal < min) {
    retVal = min;
  }
  return retVal;
}